

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5GetPoslistSize(u8 *p,int *pnSz,int *pbDel)

{
  byte bVar1;
  int iVar2;
  int nSz;
  
  bVar1 = *p;
  nSz = (int)bVar1;
  if ((char)bVar1 < '\0') {
    nSz = (uint)bVar1;
    iVar2 = sqlite3Fts5GetVarint32(p,(u32 *)&nSz);
  }
  else {
    iVar2 = 1;
  }
  *pnSz = nSz / 2;
  *pbDel = nSz & 1;
  return iVar2;
}

Assistant:

static int fts5GetPoslistSize(const u8 *p, int *pnSz, int *pbDel){
  int nSz;
  int n = 0;
  fts5FastGetVarint32(p, n, nSz);
  assert_nc( nSz>=0 );
  *pnSz = nSz/2;
  *pbDel = nSz & 0x0001;
  return n;
}